

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

uint16_t * __thiscall
capnp::SchemaLoader::Validator::makeMemberInfoArray(Validator *this,uint32_t *count)

{
  NodeUnion *pNVar1;
  uint uVar2;
  Entry *pEVar3;
  NodeUnion *pNVar4;
  uint uVar5;
  uint16_t *puVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  NodeUnion *pNVar11;
  uint uVar12;
  
  uVar7 = ((long)(this->members).table.rows.builder.pos -
           (long)(this->members).table.rows.builder.ptr >> 3) * -0x5555555555555555;
  *count = (uint32_t)uVar7;
  uVar8 = 0;
  puVar6 = (uint16_t *)
           kj::Arena::allocateBytes(&this->loader->arena,(uVar7 & 0xffffffff) * 2,2,false);
  pEVar3 = (this->members).table.rows.builder.ptr;
  pNVar4 = (this->members).table.indexes.impl.tree;
  uVar12 = (this->members).table.indexes.impl.endLeaf;
  pNVar1 = pNVar4 + uVar12;
  iVar9 = 7;
  if (pNVar4[uVar12].field_0.freelist.zero[7] == 0) {
    iVar9 = 0;
  }
  iVar9 = iVar9 + (uint)(*(int *)((long)&pNVar1->field_0 + (ulong)(uint)(iVar9 * 4) + 0x14) != 0) *
                  4;
  uVar10 = iVar9 + (uint)(*(int *)((long)&pNVar1->field_0 + (ulong)(uint)(iVar9 * 4) + 0xc) != 0) *
                   2;
  uVar2 = (this->members).table.indexes.impl.beginLeaf;
  uVar5 = (uint)(*(int *)((long)&pNVar1->field_0 + (ulong)uVar10 * 4 + 8) == 0);
  uVar10 = uVar10 + 1;
  if ((uVar2 != uVar12) || (uVar10 != uVar5)) {
    pNVar11 = pNVar4 + uVar2;
    uVar12 = 0;
    do {
      puVar6[uVar8] =
           (uint16_t)pEVar3[*(int *)((long)&pNVar11->field_0 + (ulong)uVar12 * 4 + 8) - 1].value;
      uVar12 = uVar12 + 1;
      if (((0xd < uVar12) || (*(int *)((long)&pNVar11->field_0 + (ulong)uVar12 * 4 + 8) == 0)) &&
         (uVar7 = (ulong)(pNVar11->field_0).leaf.next, uVar7 != 0)) {
        pNVar11 = pNVar4 + uVar7;
        uVar12 = 0;
      }
      uVar8 = uVar8 + 1;
    } while ((pNVar11 != pNVar1) || (uVar12 != uVar10 - uVar5));
  }
  return puVar6;
}

Assistant:

const uint16_t* makeMemberInfoArray(uint32_t* count) {
    *count = members.size();
    kj::ArrayPtr<uint16_t> result = loader.arena.allocateArray<uint16_t>(*count);
    uint pos = 0;
    for (auto& member: members) {
      result[pos++] = member.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }